

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O2

void __thiscall WorldShuffler::randomize_fox_hints(WorldShuffler *this)

{
  RandomizerOptions *pRVar1;
  HintSource *hint_source_00;
  bool bVar2;
  ushort uVar3;
  uint16_t uVar4;
  __normal_iterator<HintSource_*const_*,_std::vector<HintSource_*,_std::allocator<HintSource_*>_>_>
  _Var5;
  LandstalkerException *this_00;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  pointer ppHVar9;
  ushort uVar10;
  pointer ppHVar11;
  vector<HintSource_*,_std::allocator<HintSource_*>_> foxes_pool;
  HintSource *hint_source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pRVar1 = this->_options;
  uVar6 = (ushort)pRVar1->_hints_distribution_item_requirement;
  uVar7 = (ushort)pRVar1->_hints_distribution_region_requirement;
  uVar10 = (ushort)pRVar1->_hints_distribution_dark_region;
  uVar8 = (ushort)pRVar1->_hints_distribution_item_location;
  uVar3 = (ushort)pRVar1->_hints_distribution_joke;
  foxes_pool.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  foxes_pool.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  foxes_pool.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppHVar11 = (this->_world->_hint_sources).
             super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  for (ppHVar9 = (this->_world->_hint_sources).
                 super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppHVar9 != ppHVar11; ppHVar9 = ppHVar9 + 1) {
    hint_source = *ppHVar9;
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<HintSource*const*,std::vector<HintSource*,std::allocator<HintSource*>>>,__gnu_cxx::__ops::_Iter_equals_val<HintSource*const>>
                      ((this->_world->_used_hint_sources).
                       super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (this->_world->_used_hint_sources).
                       super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,&hint_source);
    if ((_Var5._M_current ==
         (this->_world->_used_hint_sources).
         super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       ((hint_source->_map_ids).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (hint_source->_map_ids).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      std::vector<HintSource*,std::allocator<HintSource*>>::emplace_back<HintSource*&>
                ((vector<HintSource*,std::allocator<HintSource*>> *)&foxes_pool,&hint_source);
    }
  }
  vectools::shuffle<HintSource*>(&foxes_pool,&this->_rng);
  uVar4 = RandomizerOptions::hints_count(this->_options);
  if ((ulong)((long)foxes_pool.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)foxes_pool.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) < (ulong)uVar4) {
    this_00 = (LandstalkerException *)__cxa_allocate_exception(0x28);
    uVar4 = RandomizerOptions::hints_count(this->_options);
    std::__cxx11::to_string(&local_90,(uint)uVar4);
    std::operator+(&local_70,"Hints count (",&local_90);
    std::operator+(&local_50,&local_70,") is bigger than foxes pool size (");
    std::__cxx11::to_string
              (&local_b0,
               (long)foxes_pool.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)foxes_pool.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3);
    std::operator+(&local_d0,&local_50,&local_b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hint_source
                   ,&local_d0,").");
    LandstalkerException::LandstalkerException(this_00,(string *)&hint_source);
    __cxa_throw(this_00,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException)
    ;
  }
  uVar4 = RandomizerOptions::hints_count(this->_options);
  std::vector<HintSource_*,_std::allocator<HintSource_*>_>::resize(&foxes_pool,(ulong)uVar4);
  ppHVar9 = foxes_pool.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppHVar11 = foxes_pool.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  do {
    if (ppHVar11 == ppHVar9) {
      std::_Vector_base<HintSource_*,_std::allocator<HintSource_*>_>::~_Vector_base
                (&foxes_pool.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>);
      return;
    }
    hint_source_00 = *ppHVar11;
    RandomizerWorld::add_used_hint_source(this->_world,hint_source_00);
    if (uVar10 == 0) {
LAB_0017b93d:
      if (uVar6 != 0) {
        bVar2 = generate_item_requirement_hint(this,hint_source_00);
        if (bVar2) {
          uVar6 = uVar6 - 1;
          goto LAB_0017ba0d;
        }
      }
      if (uVar7 != 0) {
        bVar2 = generate_region_requirement_hint(this,hint_source_00);
        if (bVar2) {
          uVar7 = uVar7 - 1;
          goto LAB_0017ba0d;
        }
      }
      if (uVar8 != 0) {
        bVar2 = generate_item_location_hint(this,hint_source_00);
        if (bVar2) {
          uVar8 = uVar8 - 1;
          goto LAB_0017ba0d;
        }
      }
      if (uVar3 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&hint_source,"I was meant to say something but... I forgot.",
                   (allocator<char> *)&local_d0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&hint_source_00->_text,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hint_source
                  );
        std::__cxx11::string::~string((string *)&hint_source);
        uVar3 = 0;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&hint_source,"I don\'t have anything to tell you. Move on.",
                   (allocator<char> *)&local_d0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&hint_source_00->_text,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hint_source
                  );
        std::__cxx11::string::~string((string *)&hint_source);
        uVar3 = uVar3 - 1;
      }
    }
    else {
      bVar2 = generate_dark_region_hint(this,hint_source_00);
      if (!bVar2) goto LAB_0017b93d;
      uVar10 = uVar10 - 1;
    }
LAB_0017ba0d:
    ppHVar11 = ppHVar11 + 1;
  } while( true );
}

Assistant:

void WorldShuffler::randomize_fox_hints()
{
    uint16_t remaining_item_requirement_hints = _options.hints_distribution_item_requirement();
    uint16_t remaining_region_requirement_hints = _options.hints_distribution_region_requirement();
    uint16_t remaining_dark_region_hints = _options.hints_distribution_dark_region();
    uint16_t remaining_item_location_hints = _options.hints_distribution_item_location();
    uint16_t remaining_joke_hints = _options.hints_distribution_joke();

    std::vector<HintSource*> foxes_pool;
    for(HintSource* hint_source : _world.hint_sources())
    {
        if(std::find(_world.used_hint_sources().begin(), _world.used_hint_sources().end(), hint_source) != _world.used_hint_sources().end())
            continue;
        if(hint_source->special())
            continue;

        foxes_pool.emplace_back(hint_source);
    }

    vectools::shuffle(foxes_pool, _rng);

    if(_options.hints_count() > foxes_pool.size())
    {
        throw LandstalkerException("Hints count (" + std::to_string(_options.hints_count())
                                   + ") is bigger than foxes pool size (" + std::to_string(foxes_pool.size()) +").");
    }
    foxes_pool.resize(_options.hints_count());

    // Put hints inside
    for(HintSource* hint_source : foxes_pool)
    {
        _world.add_used_hint_source(hint_source);

        if(remaining_dark_region_hints > 0)
        {
            if(this->generate_dark_region_hint(hint_source))
            {
                remaining_dark_region_hints--;
                continue;
            }
        }
        if(remaining_item_requirement_hints > 0)
        {
            if(this->generate_item_requirement_hint(hint_source))
            {
                remaining_item_requirement_hints--;
                continue;
            }
        }
        if(remaining_region_requirement_hints > 0)
        {
            if(this->generate_region_requirement_hint(hint_source))
            {
                remaining_region_requirement_hints--;
                continue;
            }
        }
        if(remaining_item_location_hints > 0)
        {
            if(this->generate_item_location_hint(hint_source))
            {
                remaining_item_location_hints--;
                continue;
            }
        }
        if(remaining_joke_hints > 0)
        {
            hint_source->text("I don't have anything to tell you. Move on.");
            remaining_joke_hints--;
            continue;
        }

        // Fallback if none of the options above were matching
        hint_source->text("I was meant to say something but... I forgot.");
    }
}